

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopDivideByCube(Kit_Sop_t *cSop,Kit_Sop_t *cDiv,Kit_Sop_t *vQuo,Kit_Sop_t *vRem,
                        Vec_Int_t *vMemory)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  uint *puVar6;
  int *piVar7;
  
  if (cDiv->nCubes != 1) {
    __assert_fail("Kit_SopCubeNum(cDiv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitSop.c"
                  ,0x96,
                  "void Kit_SopDivideByCube(Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  uVar1 = *cDiv->pCubes;
  vQuo->nCubes = 0;
  puVar3 = Vec_IntFetch(vMemory,cSop->nCubes);
  vQuo->pCubes = puVar3;
  vRem->nCubes = 0;
  puVar3 = Vec_IntFetch(vMemory,cSop->nCubes);
  vRem->pCubes = puVar3;
  for (lVar4 = 0; (lVar4 < cSop->nCubes && (uVar5 = cSop->pCubes[lVar4], uVar5 != 0));
      lVar4 = lVar4 + 1) {
    puVar6 = puVar3;
    piVar7 = &vRem->nCubes;
    if ((uVar1 & ~uVar5) == 0) {
      uVar5 = uVar5 & ~uVar1;
      puVar6 = vQuo->pCubes;
      piVar7 = &vQuo->nCubes;
    }
    iVar2 = *piVar7;
    *piVar7 = iVar2 + 1;
    puVar6[iVar2] = uVar5;
  }
  return;
}

Assistant:

void Kit_SopDivideByCube( Kit_Sop_t * cSop, Kit_Sop_t * cDiv, Kit_Sop_t * vQuo, Kit_Sop_t * vRem, Vec_Int_t * vMemory )
{
    unsigned uCube, uDiv;
    int i;
    // get the only cube
    assert( Kit_SopCubeNum(cDiv) == 1 );
    uDiv = Kit_SopCube(cDiv, 0);
    // allocate covers
    vQuo->nCubes = 0;
    vQuo->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    vRem->nCubes = 0;
    vRem->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    // sort the cubes
    Kit_SopForEachCube( cSop, uCube, i )
    {
        if ( Kit_CubeContains( uCube, uDiv ) )
            Kit_SopPushCube( vQuo, Kit_CubeSharp(uCube, uDiv) );
        else
            Kit_SopPushCube( vRem, uCube );
    }
}